

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_compute_blob.h
# Opt level: O2

void ncnn::gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar6;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 uVar7;
  bool bVar8;
  float *pfVar9;
  undefined8 *puVar10;
  uint uVar11;
  float *pfVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  int iVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 *local_a0;
  
  iVar16 = grid->h * grid->w;
  local_a0 = (undefined8 *)offset_value->data;
  if (permute_fusion == 0) {
    pvVar3 = grid->data;
    sVar4 = grid->cstep;
    sVar5 = grid->elemsize;
    for (lVar14 = 0; lVar14 < grid->c; lVar14 = lVar14 + 1) {
      puVar10 = (undefined8 *)(sVar4 * sVar5 * lVar14 + (long)pvVar3);
      for (iVar13 = 0; iVar13 < iVar16; iVar13 = iVar13 + 2) {
        uVar2 = src->w;
        uVar7 = src->h;
        fVar21 = (float)(uVar2 + -1) * ((float)*puVar10 * 0.5 + 0.5);
        fVar25 = (float)(uVar7 + -1) * ((float)((ulong)*puVar10 >> 0x20) * 0.5 + 0.5);
        fVar22 = floorf(fVar21);
        fVar23 = floorf(fVar25);
        iVar24 = (int)fVar22;
        *local_a0 = CONCAT44(fVar25 - (float)(int)fVar23,fVar21 - (float)iVar24);
        auVar29._0_4_ = (float)(int)uVar2 + -1.0;
        auVar33._0_4_ = (float)(iVar24 + 2);
        auVar33._4_4_ = (float)(iVar24 + 1);
        auVar33._8_4_ = (float)(iVar24 + -1);
        auVar33._12_4_ = (float)iVar24;
        auVar32 = maxps(auVar33,_DAT_005370d0);
        auVar29._4_4_ = auVar29._0_4_;
        auVar29._8_4_ = auVar29._0_4_;
        auVar29._12_4_ = auVar29._0_4_;
        auVar29 = minps(auVar29,auVar32);
        auVar32._0_4_ = (int)auVar29._0_4_;
        auVar32._4_4_ = (int)auVar29._4_4_;
        auVar32._8_4_ = (int)auVar29._8_4_;
        auVar32._12_4_ = (int)auVar29._12_4_;
        auVar30._0_4_ = -(uint)(auVar32._0_4_ < (int)uVar2);
        auVar30._4_4_ = -(uint)(auVar32._4_4_ < (int)uVar2);
        auVar30._8_4_ = -(uint)(auVar32._8_4_ < (int)uVar2);
        auVar30._12_4_ = -(uint)(auVar32._12_4_ < (int)uVar2);
        uVar11 = movmskps((int)local_a0,~auVar32 & auVar30);
        iVar24 = (int)fVar23 + -1;
        for (lVar15 = 8; (int)lVar15 != 0x48; lVar15 = lVar15 + 0x10) {
          fVar21 = (float)iVar24;
          if ((float)iVar24 <= 0.0) {
            fVar21 = 0.0;
          }
          fVar22 = (float)src->h + -1.0;
          if (fVar21 <= fVar22) {
            fVar22 = fVar21;
          }
          iVar18 = (int)fVar22;
          iVar17 = src->w * iVar18;
          bVar20 = iVar18 < 0;
          bVar8 = src->h <= iVar18;
          iVar19 = -1;
          iVar18 = (auVar32._8_4_ + iVar17) * src->elempack;
          if (bVar20 || bVar8) {
            iVar18 = iVar19;
          }
          if ((uVar11 & 4) == 0) {
            iVar18 = -1;
          }
          *(int *)((long)local_a0 + lVar15) = iVar18;
          iVar18 = (auVar32._12_4_ + iVar17) * src->elempack;
          if (bVar20 || bVar8) {
            iVar18 = iVar19;
          }
          if ((byte)((byte)uVar11 >> 3) == 0) {
            iVar18 = -1;
          }
          *(int *)((long)local_a0 + lVar15 + 4) = iVar18;
          iVar18 = (auVar32._4_4_ + iVar17) * src->elempack;
          if (bVar20 || bVar8) {
            iVar18 = iVar19;
          }
          if ((uVar11 & 2) == 0) {
            iVar18 = iVar19;
          }
          *(int *)((long)local_a0 + lVar15 + 8) = iVar18;
          iVar18 = (iVar17 + auVar32._0_4_) * src->elempack;
          if (bVar20 || bVar8) {
            iVar18 = iVar19;
          }
          if ((uVar11 & 1) == 0) {
            iVar18 = iVar19;
          }
          *(int *)((long)local_a0 + lVar15 + 0xc) = iVar18;
          iVar24 = iVar24 + 1;
        }
        puVar10 = puVar10 + 1;
        local_a0 = local_a0 + 9;
      }
    }
  }
  else {
    pfVar9 = (float *)grid->data;
    pfVar12 = (float *)(grid->elemsize * grid->cstep + (long)pfVar9);
    iVar13 = 0;
    if (iVar16 < 1) {
      iVar16 = 0;
    }
    for (; iVar13 != iVar16; iVar13 = iVar13 + 1) {
      uVar1 = src->w;
      uVar6 = src->h;
      fVar21 = (float)(uVar1 + -1) * (*pfVar9 * 0.5 + 0.5);
      fVar25 = (float)(uVar6 + -1) * (*pfVar12 * 0.5 + 0.5);
      fVar22 = floorf(fVar21);
      fVar23 = floorf(fVar25);
      iVar24 = (int)fVar22;
      *local_a0 = CONCAT44(fVar25 - (float)(int)fVar23,fVar21 - (float)iVar24);
      auVar27._0_4_ = (float)(int)uVar1 + -1.0;
      auVar31._0_4_ = (float)(iVar24 + 2);
      auVar31._4_4_ = (float)(iVar24 + 1);
      auVar31._8_4_ = (float)(iVar24 + -1);
      auVar31._12_4_ = (float)iVar24;
      auVar32 = maxps(auVar31,_DAT_005370d0);
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar32 = minps(auVar27,auVar32);
      auVar26._0_4_ = (int)auVar32._0_4_;
      auVar26._4_4_ = (int)auVar32._4_4_;
      auVar26._8_4_ = (int)auVar32._8_4_;
      auVar26._12_4_ = (int)auVar32._12_4_;
      auVar28._0_4_ = -(uint)(auVar26._0_4_ < (int)uVar1);
      auVar28._4_4_ = -(uint)(auVar26._4_4_ < (int)uVar1);
      auVar28._8_4_ = -(uint)(auVar26._8_4_ < (int)uVar1);
      auVar28._12_4_ = -(uint)(auVar26._12_4_ < (int)uVar1);
      uVar11 = movmskps((int)local_a0,~auVar26 & auVar28);
      iVar24 = (int)fVar23 + -1;
      for (lVar14 = 8; (int)lVar14 != 0x48; lVar14 = lVar14 + 0x10) {
        fVar21 = (float)iVar24;
        if ((float)iVar24 <= 0.0) {
          fVar21 = 0.0;
        }
        fVar22 = (float)src->h + -1.0;
        if (fVar21 <= fVar22) {
          fVar22 = fVar21;
        }
        iVar18 = (int)fVar22;
        iVar17 = src->w * iVar18;
        bVar20 = iVar18 < 0;
        bVar8 = src->h <= iVar18;
        iVar19 = -1;
        iVar18 = (iVar17 + auVar26._8_4_) * src->elempack;
        if (bVar20 || bVar8) {
          iVar18 = iVar19;
        }
        if ((uVar11 & 4) == 0) {
          iVar18 = -1;
        }
        *(int *)((long)local_a0 + lVar14) = iVar18;
        iVar18 = (iVar17 + auVar26._12_4_) * src->elempack;
        if (bVar20 || bVar8) {
          iVar18 = iVar19;
        }
        if ((byte)((byte)uVar11 >> 3) == 0) {
          iVar18 = -1;
        }
        *(int *)((long)local_a0 + lVar14 + 4) = iVar18;
        iVar18 = (iVar17 + auVar26._4_4_) * src->elempack;
        if (bVar20 || bVar8) {
          iVar18 = iVar19;
        }
        if ((uVar11 & 2) == 0) {
          iVar18 = iVar19;
        }
        *(int *)((long)local_a0 + lVar14 + 8) = iVar18;
        iVar18 = (iVar17 + auVar26._0_4_) * src->elempack;
        if (bVar20 || bVar8) {
          iVar18 = iVar19;
        }
        if ((uVar11 & 1) == 0) {
          iVar18 = iVar19;
        }
        *(int *)((long)local_a0 + lVar14 + 0xc) = iVar18;
        iVar24 = iVar24 + 1;
      }
      pfVar9 = pfVar9 + 1;
      pfVar12 = pfVar12 + 1;
      local_a0 = local_a0 + 9;
    }
  }
  return;
}

Assistant:

void gridsample_2d_bicubic_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gy = unormalize(_mm256_set1_ps(src.h), gy);

                __m256 gx_floor = _mm256_floor_ps(gx);
                __m256 gy_floor = _mm256_floor_ps(gy);

                __m256 tx = _mm256_sub_ps(gx, gx_floor);
                __m256 ty = _mm256_sub_ps(gy, gy_floor);

                __m256 gx0 = _mm256_add_ps(gx_floor, _mm256_set1_ps(-1));
                __m256 gx1 = gx_floor;
                __m256 gx2 = _mm256_add_ps(gx_floor, _mm256_set1_ps(1));
                __m256 gx3 = _mm256_add_ps(gx2, _mm256_set1_ps(1));

                gx0 = get_coord(_mm256_set1_ps(src.w), gx0);
                gx1 = get_coord(_mm256_set1_ps(src.w), gx1);
                gx2 = get_coord(_mm256_set1_ps(src.w), gx2);
                gx3 = get_coord(_mm256_set1_ps(src.w), gx3);

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(gx0, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx0, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(gx1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx1, _CMP_GT_OS));
                __m256 x2_in_range = _mm256_and_ps(_mm256_cmp_ps(gx2, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx2, _CMP_GT_OS));
                __m256 x3_in_range = _mm256_and_ps(_mm256_cmp_ps(gx3, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx3, _CMP_GT_OS));
                __m256 v0_offset_f[4], v1_offset_f[4], v2_offset_f[4], v3_offset_f[4];
                for (int i = 0; i < 4; i++)
                {
                    gy = _mm256_add_ps(gy_floor, _mm256_set1_ps(-1.0f + i));
                    gy = get_coord(_mm256_set1_ps(src.h), gy);

                    __m256 y_in_range = _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS));

                    __m256 gy_offset = _mm256_mul_ps(gy, _mm256_set1_ps(src.w));

                    v0_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx0), _mm256_set1_ps(src.elempack));
                    v1_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx1), _mm256_set1_ps(src.elempack));
                    v2_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx2), _mm256_set1_ps(src.elempack));
                    v3_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx3), _mm256_set1_ps(src.elempack));

                    v0_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v0_offset_f[i], _mm256_and_ps(x0_in_range, y_in_range));
                    v1_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v1_offset_f[i], _mm256_and_ps(x1_in_range, y_in_range));
                    v2_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v2_offset_f[i], _mm256_and_ps(x2_in_range, y_in_range));
                    v3_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v3_offset_f[i], _mm256_and_ps(x3_in_range, y_in_range));

                    v0_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v0_offset_f[i]));
                    v1_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v1_offset_f[i]));
                    v2_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v2_offset_f[i]));
                    v3_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v3_offset_f[i]));
                }

                transpose8x18_ps(tx, ty, v0_offset_f[0], v1_offset_f[0], v2_offset_f[0], v3_offset_f[0], v0_offset_f[1], v1_offset_f[1], v2_offset_f[1], v3_offset_f[1], v0_offset_f[2], v1_offset_f[2], v2_offset_f[2], v3_offset_f[2], v0_offset_f[3], v1_offset_f[3], v2_offset_f[3], v3_offset_f[3]);

                _mm256_storeu_ps(offset_value_ptr, tx);
                _mm256_storeu_ps(offset_value_ptr + 8, ty);
                offset_value_ptr += 16;
                for (int i = 0; i < 4; i++)
                {
                    _mm256_storeu_ps(offset_value_ptr, v0_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 8, v1_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 16, v2_offset_f[i]);
                    _mm256_storeu_ps(offset_value_ptr + 24, v3_offset_f[i]);
                    offset_value_ptr += 32;
                }
                gridptr += 16;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_y = unormalize(src.h, sample_y);

                int x1 = floorf(sample_x);
                int y1 = floorf(sample_y);
                int x0 = x1 - 1;
                int x2 = x1 + 1;
                int x3 = x1 + 2;

                offset_value_ptr[0] = sample_x - static_cast<float>(x1);
                offset_value_ptr[1] = sample_y - static_cast<float>(y1);

                x1 = get_coord(src.w, x1);
                x0 = get_coord(src.w, x0);
                x2 = get_coord(src.w, x2);
                x3 = get_coord(src.w, x3);

                bool x1_in_range = (x1 > -1) & (x1 < src.w);
                bool x0_in_range = (x0 > -1) & (x0 < src.w);
                bool x2_in_range = (x2 > -1) & (x2 < src.w);
                bool x3_in_range = (x3 > -1) & (x3 < src.w);

                int* offset_ptr = (int*)offset_value_ptr + 2;

                for (int i = 0; i < 4; i++)
                {
                    int gy = y1 + i - 1;
                    gy = get_coord(src.h, gy);
                    int offset_y = gy * src.w;

                    bool y_in_range = (gy > -1) & (gy < src.h);

                    bool v0_in_bound = (x0_in_range & y_in_range);
                    bool v1_in_bound = (x1_in_range & y_in_range);
                    bool v2_in_bound = (x2_in_range & y_in_range);
                    bool v3_in_bound = (x3_in_range & y_in_range);

                    offset_ptr[0] = v0_in_bound ? (offset_y + x0) * src.elempack : -1.0;
                    offset_ptr[1] = v1_in_bound ? (offset_y + x1) * src.elempack : -1.0;
                    offset_ptr[2] = v2_in_bound ? (offset_y + x2) * src.elempack : -1.0;
                    offset_ptr[3] = v3_in_bound ? (offset_y + x3) * src.elempack : -1.0;

                    offset_ptr += 4;
                }

                gridptr += 2;
                offset_value_ptr += 18;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gy = unormalize(_mm256_set1_ps(src.h), gy);

            __m256 gx_floor = _mm256_floor_ps(gx);
            __m256 gy_floor = _mm256_floor_ps(gy);

            __m256 tx = _mm256_sub_ps(gx, gx_floor);
            __m256 ty = _mm256_sub_ps(gy, gy_floor);

            __m256 gx0 = _mm256_add_ps(gx_floor, _mm256_set1_ps(-1));
            __m256 gx1 = gx_floor;
            __m256 gx2 = _mm256_add_ps(gx_floor, _mm256_set1_ps(1));
            __m256 gx3 = _mm256_add_ps(gx2, _mm256_set1_ps(1));

            gx0 = get_coord(_mm256_set1_ps(src.w), gx0);
            gx1 = get_coord(_mm256_set1_ps(src.w), gx1);
            gx2 = get_coord(_mm256_set1_ps(src.w), gx2);
            gx3 = get_coord(_mm256_set1_ps(src.w), gx3);

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(gx0, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx0, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(gx1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx1, _CMP_GT_OS));
            __m256 x2_in_range = _mm256_and_ps(_mm256_cmp_ps(gx2, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx2, _CMP_GT_OS));
            __m256 x3_in_range = _mm256_and_ps(_mm256_cmp_ps(gx3, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx3, _CMP_GT_OS));

            __m256 v0_offset_f[4], v1_offset_f[4], v2_offset_f[4], v3_offset_f[4];
            for (int i = 0; i < 4; i++)
            {
                gy = _mm256_add_ps(gy_floor, _mm256_set1_ps(-1.0f + i));
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                __m256 y_in_range = _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS));

                __m256 gy_offset = _mm256_mul_ps(gy, _mm256_set1_ps(src.w));

                v0_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx0), _mm256_set1_ps(src.elempack));
                v1_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx1), _mm256_set1_ps(src.elempack));
                v2_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx2), _mm256_set1_ps(src.elempack));
                v3_offset_f[i] = _mm256_mul_ps(_mm256_add_ps(gy_offset, gx3), _mm256_set1_ps(src.elempack));

                v0_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v0_offset_f[i], _mm256_and_ps(x0_in_range, y_in_range));
                v1_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v1_offset_f[i], _mm256_and_ps(x1_in_range, y_in_range));
                v2_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v2_offset_f[i], _mm256_and_ps(x2_in_range, y_in_range));
                v3_offset_f[i] = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), v3_offset_f[i], _mm256_and_ps(x3_in_range, y_in_range));

                v0_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v0_offset_f[i]));
                v1_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v1_offset_f[i]));
                v2_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v2_offset_f[i]));
                v3_offset_f[i] = _mm256_castsi256_ps(_mm256_cvtps_epi32(v3_offset_f[i]));
            }

            transpose8x18_ps(tx, ty, v0_offset_f[0], v1_offset_f[0], v2_offset_f[0], v3_offset_f[0], v0_offset_f[1], v1_offset_f[1], v2_offset_f[1], v3_offset_f[1], v0_offset_f[2], v1_offset_f[2], v2_offset_f[2], v3_offset_f[2], v0_offset_f[3], v1_offset_f[3], v2_offset_f[3], v3_offset_f[3]);

            _mm256_storeu_ps(offset_value_ptr, tx);
            _mm256_storeu_ps(offset_value_ptr + 8, ty);
            offset_value_ptr += 16;
            for (int i = 0; i < 4; i++)
            {
                _mm256_storeu_ps(offset_value_ptr, v0_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 8, v1_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 16, v2_offset_f[i]);
                _mm256_storeu_ps(offset_value_ptr + 24, v3_offset_f[i]);
                offset_value_ptr += 32;
            }

            gridptr_x += 8;
            gridptr_y += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_y = unormalize(src.h, sample_y);

            int x1 = floorf(sample_x);
            int y1 = floorf(sample_y);
            int x0 = x1 - 1;
            int x2 = x1 + 1;
            int x3 = x1 + 2;

            offset_value_ptr[0] = sample_x - static_cast<float>(x1);
            offset_value_ptr[1] = sample_y - static_cast<float>(y1);

            x1 = get_coord(src.w, x1);
            x0 = get_coord(src.w, x0);
            x2 = get_coord(src.w, x2);
            x3 = get_coord(src.w, x3);

            bool x1_in_range = (x1 > -1) & (x1 < src.w);
            bool x0_in_range = (x0 > -1) & (x0 < src.w);
            bool x2_in_range = (x2 > -1) & (x2 < src.w);
            bool x3_in_range = (x3 > -1) & (x3 < src.w);

            int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int i = 0; i < 4; i++)
            {
                int gy = y1 + i - 1;
                gy = get_coord(src.h, gy);
                int offset_y = gy * src.w;

                bool y_in_range = (gy > -1) & (gy < src.h);

                bool v0_in_bound = (x0_in_range & y_in_range);
                bool v1_in_bound = (x1_in_range & y_in_range);
                bool v2_in_bound = (x2_in_range & y_in_range);
                bool v3_in_bound = (x3_in_range & y_in_range);

                offset_ptr[0] = v0_in_bound ? (offset_y + x0) * src.elempack : -1.0;
                offset_ptr[1] = v1_in_bound ? (offset_y + x1) * src.elempack : -1.0;
                offset_ptr[2] = v2_in_bound ? (offset_y + x2) * src.elempack : -1.0;
                offset_ptr[3] = v3_in_bound ? (offset_y + x3) * src.elempack : -1.0;

                offset_ptr += 4;
            }

            gridptr_x++;
            gridptr_y++;

            offset_value_ptr += 18;
        }
    }
}